

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

string * __thiscall
LTAircraft::FlightPhase2String_abi_cxx11_
          (string *__return_storage_ptr__,LTAircraft *this,flightPhaseE phase)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 < 0x28) {
    if (0x13 < iVar2) {
      switch(iVar2) {
      case 0x14:
        pcVar3 = "Take Off";
        pcVar1 = "";
        break;
      case 0x15:
        pcVar3 = "Take Off Roll";
        pcVar1 = "";
        break;
      case 0x16:
        pcVar3 = "Rotate";
        pcVar1 = "";
        break;
      case 0x17:
        pcVar3 = "Lift Off";
        pcVar1 = "";
        break;
      case 0x18:
        pcVar3 = "Initial Climb";
        pcVar1 = "";
        break;
      default:
        goto switchD_00151b23_caseD_19;
      case 0x1e:
        pcVar3 = "Climb";
        pcVar1 = "";
      }
      goto LAB_00151cb5;
    }
    if (iVar2 == 0) {
      pcVar3 = "Unknown";
      pcVar1 = "";
      goto LAB_00151cb5;
    }
    if (iVar2 == 5) {
      pcVar3 = "Parked";
      pcVar1 = "";
      goto LAB_00151cb5;
    }
    if (iVar2 == 10) {
      pcVar3 = "Taxi";
      pcVar1 = "";
      goto LAB_00151cb5;
    }
    goto switchD_00151b23_caseD_19;
  }
  switch(iVar2) {
  case 0x3c:
    pcVar3 = "Approach";
    pcVar1 = "";
    break;
  case 0x3d:
    pcVar3 = "Final";
    pcVar1 = "";
    break;
  case 0x46:
    pcVar3 = "Landing";
    pcVar1 = "";
    break;
  case 0x47:
    pcVar3 = "Flare";
    pcVar1 = "";
    break;
  case 0x48:
    pcVar3 = "Touch Down";
    pcVar1 = "";
    break;
  case 0x49:
    pcVar3 = "Roll Out";
    pcVar1 = "";
    break;
  case 0x4a:
    pcVar3 = "Stopped";
    pcVar1 = "";
    break;
  default:
    if (iVar2 == 0x28) {
      pcVar3 = "Cruise";
      pcVar1 = "";
      break;
    }
    if (iVar2 == 0x32) {
      pcVar3 = "Descend";
      pcVar1 = "";
      break;
    }
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
switchD_00151b23_caseD_19:
    pcVar3 = "?";
    pcVar1 = "";
  }
LAB_00151cb5:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string LTAircraft::FlightPhase2String (flightPhaseE phase)
{
    switch (phase) {
        case FPH_UNKNOWN:           return "Unknown";
        case FPH_PARKED:            return "Parked";
        case FPH_TAXI:              return "Taxi";
        case FPH_TAKE_OFF:          return "Take Off";
        case FPH_TO_ROLL:           return "Take Off Roll";
        case FPH_ROTATE:            return "Rotate";
        case FPH_LIFT_OFF:          return "Lift Off";
        case FPH_INITIAL_CLIMB:     return "Initial Climb";
        case FPH_CLIMB:             return "Climb";
        case FPH_CRUISE:            return "Cruise";
        case FPH_DESCEND:           return "Descend";
        case FPH_APPROACH:          return "Approach";
        case FPH_FINAL:             return "Final";
        case FPH_LANDING:           return "Landing";
        case FPH_FLARE:             return "Flare";
        case FPH_TOUCH_DOWN:        return "Touch Down";
        case FPH_ROLL_OUT:          return "Roll Out";
        case FPH_STOPPED_ON_RWY:    return "Stopped";
    }
    // must not get here...then we missed a value in the above switch
    LOG_ASSERT(phase!=FPH_UNKNOWN);
    return "?";
}